

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

int __thiscall cfd::core::OutPoint::Compare(OutPoint *this,OutPoint *object)

{
  int iVar1;
  string local_58;
  string local_38;
  
  if (this->vout_ < object->vout_) {
    iVar1 = 1;
  }
  else if (object->vout_ < this->vout_) {
    iVar1 = -1;
  }
  else {
    Txid::GetHex_abi_cxx11_(&local_58,&this->txid_);
    Txid::GetHex_abi_cxx11_(&local_38,&object->txid_);
    iVar1 = strncmp(local_58._M_dataplus._M_p,local_38._M_dataplus._M_p,0x40);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  return iVar1;
}

Assistant:

int OutPoint::Compare(const OutPoint &object) const {
  if (vout_ < object.vout_)
    return 1;
  else if (vout_ > object.vout_)
    return -1;
  return std::strncmp(
      txid_.GetHex().c_str(), object.txid_.GetHex().c_str(),
      kByteData256Length * 2);
}